

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O2

int tc_uECC_valid_point(tc_uECC_word_t *point,tc_uECC_Curve curve)

{
  char num_words;
  cmpresult_t cVar1;
  tc_uECC_word_t tVar2;
  int iVar3;
  tc_uECC_word_t local_78 [2];
  tc_uECC_word_t tmp1 [8];
  tc_uECC_word_t tmp2 [8];
  
  num_words = curve->num_words;
  tVar2 = EccPoint_isZero(point,curve);
  if (tVar2 == 0) {
    cVar1 = tc_uECC_vli_cmp_unsafe(curve->p,point,num_words);
    iVar3 = -2;
    if (cVar1 == '\x01') {
      cVar1 = tc_uECC_vli_cmp_unsafe(curve->p,point + num_words,num_words);
      if (cVar1 == '\x01') {
        tc_uECC_vli_modSquare_fast(local_78,point + num_words,curve);
        (*curve->x_side)(tmp1 + 6,point,curve);
        tVar2 = tc_uECC_vli_equal(local_78,tmp1 + 6,num_words);
        iVar3 = (uint)(tVar2 == 0) * 3 + -3;
      }
    }
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int tc_uECC_valid_point(const tc_uECC_word_t *point, tc_uECC_Curve curve)
{
	tc_uECC_word_t tmp1[NUM_ECC_WORDS];
	tc_uECC_word_t tmp2[NUM_ECC_WORDS];
	wordcount_t num_words = curve->num_words;

	/* The point at infinity is invalid. */
	if (EccPoint_isZero(point, curve)) {
		return -1;
	}

	/* x and y must be smaller than p. */
	if (tc_uECC_vli_cmp_unsafe(curve->p, point, num_words) != 1 ||
		tc_uECC_vli_cmp_unsafe(curve->p, point + num_words, num_words) != 1) {
		return -2;
	}

	tc_uECC_vli_modSquare_fast(tmp1, point + num_words, curve);
	curve->x_side(tmp2, point, curve); /* tmp2 = x^3 + ax + b */

	/* Make sure that y^2 == x^3 + ax + b */
	if (tc_uECC_vli_equal(tmp1, tmp2, num_words) != 0)
		return -3;

	return 0;
}